

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O0

int ffcpfl(fitsfile *infptr,fitsfile *outfptr,int previous,int current,int following,int *status)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  fitsfile *in_RSI;
  fitsfile *in_RDI;
  int in_R8D;
  int *in_R9;
  int ii;
  int hdunum;
  int *in_stack_00000030;
  int *in_stack_00000038;
  int in_stack_00000044;
  fitsfile *in_stack_00000048;
  int local_38;
  int local_34;
  int local_4;
  
  if (*in_R9 < 1) {
    if (in_RDI == in_RSI) {
      *in_R9 = 0x65;
      local_4 = 0x65;
    }
    else {
      ffghdn(in_RDI,&local_34);
      if (in_EDX != 0) {
        for (local_38 = 1; local_38 < local_34; local_38 = local_38 + 1) {
          ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
          ffcopy(in_RSI,(fitsfile *)CONCAT44(in_EDX,in_ECX),in_R8D,in_R9);
        }
      }
      if ((in_ECX != 0) && (*in_R9 < 1)) {
        ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
        ffcopy(in_RSI,(fitsfile *)CONCAT44(in_EDX,in_ECX),in_R8D,in_R9);
      }
      if ((in_R8D != 0) && (*in_R9 < 1)) {
        do {
          iVar1 = ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
          if (iVar1 != 0) {
            if (*in_R9 == 0x6b) {
              *in_R9 = 0;
            }
            break;
          }
          iVar1 = ffcopy(in_RSI,(fitsfile *)CONCAT44(in_EDX,in_ECX),in_R8D,in_R9);
        } while (iVar1 == 0);
      }
      ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
      local_4 = *in_R9;
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffcpfl(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int previous,        /* I - copy any previous HDUs?   */
           int current,         /* I - copy the current HDU?     */
           int following,       /* I - copy any following HDUs?   */
           int *status)         /* IO - error status     */
/*
  copy all or part of the input file to the output file.
*/
{
    int hdunum, ii;

    if (*status > 0)
        return(*status);

    if (infptr == outfptr)
        return(*status = SAME_FILE);

    ffghdn(infptr, &hdunum);

    if (previous) {   /* copy any previous HDUs */
        for (ii=1; ii < hdunum; ii++) {
            ffmahd(infptr, ii, NULL, status);
            ffcopy(infptr, outfptr, 0, status);
        }
    }

    if (current && (*status <= 0) ) {  /* copy current HDU */
        ffmahd(infptr, hdunum, NULL, status);
        ffcopy(infptr, outfptr, 0, status);
    }

    if (following && (*status <= 0) ) { /* copy any remaining HDUs */
        ii = hdunum + 1;
        while (1)
        { 
            if (ffmahd(infptr, ii, NULL, status) ) {
                 /* reset expected end of file status */
                 if (*status == END_OF_FILE)
                    *status = 0;
                 break;
            }

            if (ffcopy(infptr, outfptr, 0, status))
                 break;  /* quit on unexpected error */

            ii++;
        }
    }

    ffmahd(infptr, hdunum, NULL, status);  /* restore initial position */
    return(*status);
}